

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  shared_container_t *container;
  container_t *candidate_shared_container;
  roaring_array_t *prVar2;
  uint8_t typecode;
  _Bool _Var3;
  uint uVar4;
  array_container_t *src_1;
  array_container_t *src_2;
  ushort *puVar5;
  int iVar6;
  roaring_array_t *ra;
  uint uVar7;
  uint begin;
  uint16_t key;
  uint new_begin;
  uint8_t result_type;
  byte local_5a;
  byte local_59;
  array_container_t *local_58;
  uint local_50;
  uint local_4c;
  roaring_array_t *local_48;
  uint local_3c;
  roaring_array_t *local_38;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x3ec9,
                  "void roaring_bitmap_andnot_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)"
                 );
  }
  result_type = '\0';
  local_3c = (x2->high_low_container).size;
  if (local_3c == 0) {
    return;
  }
  local_4c = (x1->high_low_container).size;
  if (local_4c == 0) {
    ra_reset(&x1->high_low_container);
    return;
  }
  key = *(x1->high_low_container).keys;
  puVar5 = (x2->high_low_container).keys;
  uVar4 = 0;
  new_begin = 0;
  uVar7 = 0;
  local_48 = &x1->high_low_container;
  local_38 = &x2->high_low_container;
LAB_00112530:
  do {
    uVar1 = *puVar5;
    ra = local_48;
    begin = uVar7;
    local_50 = uVar4;
    while( true ) {
      prVar2 = local_38;
      uVar7 = begin + 1;
      if (key == uVar1) break;
      if (uVar1 <= key) {
        uVar4 = ra_advance_until(local_38,key,local_50);
        if (uVar4 == local_3c) goto LAB_001127f9;
        puVar5 = (ushort *)((ulong)((uVar4 & 0xffff) * 2) + (long)prVar2->keys);
        uVar7 = begin;
        goto LAB_00112530;
      }
      if (new_begin != begin) {
        ra_replace_key_and_container_at_index
                  (local_48,new_begin,key,ra->containers[(ulong)begin & 0xffff],
                   ra->typecodes[(ulong)begin & 0xffff]);
        ra = local_48;
      }
      if (local_4c == uVar7) {
        new_begin = new_begin + 1;
        goto LAB_001127c8;
      }
      key = ra->keys[uVar7 & 0xffff];
      new_begin = new_begin + 1;
      begin = uVar7;
    }
    container = (shared_container_t *)ra->containers[begin & 0xffff];
    candidate_shared_container = local_38->containers[local_50 & 0xffff];
    if (ra->typecodes[begin & 0xffff] == 4) {
      src_1 = (array_container_t *)
              container_andnot(container,'\x04',candidate_shared_container,
                               local_38->typecodes[local_50 & 0xffff],&result_type);
      shared_container_free(container);
      typecode = result_type;
      goto LAB_0011273f;
    }
    local_5a = local_38->typecodes[local_50 & 0xffff];
    local_59 = ra->typecodes[begin & 0xffff];
    src_1 = (array_container_t *)get_writable_copy_if_shared(container,&local_59);
    src_2 = (array_container_t *)container_unwrap_shared(candidate_shared_container,&local_5a);
    local_58 = (array_container_t *)0x0;
    switch((uint)local_5a + (uint)local_59 * 4) {
    case 5:
      _Var3 = bitset_bitset_container_iandnot
                        ((bitset_container_t *)src_1,(bitset_container_t *)src_2,&local_58);
      break;
    case 6:
      _Var3 = bitset_array_container_iandnot((bitset_container_t *)src_1,src_2,&local_58);
      break;
    case 7:
      _Var3 = bitset_run_container_iandnot
                        ((bitset_container_t *)src_1,(run_container_t *)src_2,&local_58);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x17cd,
                    "container_t *container_iandnot(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                   );
    case 9:
      result_type = '\x02';
      array_bitset_container_iandnot(src_1,(bitset_container_t *)src_2);
      goto LAB_0011270a;
    case 10:
      array_array_container_iandnot(src_1,src_2);
      result_type = '\x02';
      goto LAB_0011270a;
    case 0xb:
      result_type = '\x02';
      array_run_container_iandnot(src_1,(run_container_t *)src_2);
LAB_0011270a:
      typecode = '\x02';
      goto LAB_0011273f;
    case 0xd:
      _Var3 = run_bitset_container_iandnot
                        ((run_container_t *)src_1,(bitset_container_t *)src_2,&local_58);
      break;
    case 0xe:
      iVar6 = run_array_container_iandnot((run_container_t *)src_1,src_2,&local_58);
      typecode = (uint8_t)iVar6;
      src_1 = local_58;
      result_type = typecode;
      goto LAB_0011273f;
    case 0xf:
      iVar6 = run_run_container_iandnot((run_container_t *)src_1,(run_container_t *)src_2,&local_58)
      ;
      typecode = (uint8_t)iVar6;
      src_1 = local_58;
      result_type = typecode;
      goto LAB_0011273f;
    }
    typecode = '\x02' - _Var3;
    src_1 = local_58;
    result_type = typecode;
LAB_0011273f:
    _Var3 = container_nonzero_cardinality(src_1,typecode);
    if (_Var3) {
      ra_replace_key_and_container_at_index(local_48,new_begin,key,src_1,typecode);
      new_begin = new_begin + 1;
    }
    else {
      container_free(src_1,typecode);
    }
    begin = uVar7;
    if ((local_4c == uVar7) || (uVar4 = local_50 + 1, uVar4 == local_3c)) {
LAB_001127f9:
      iVar6 = local_4c - begin;
      ra = local_48;
      if (iVar6 != 0 && (int)begin <= (int)local_4c) {
        if ((int)new_begin < (int)begin) {
          ra_copy_range(local_48,begin,local_4c,new_begin);
        }
        new_begin = iVar6 + new_begin;
        ra = local_48;
      }
LAB_001127c8:
      ra_downsize(ra,new_begin);
      return;
    }
    key = local_48->keys[uVar7 & 0xffff];
    puVar5 = (ushort *)((ulong)((uVar4 & 0xffff) * 2) + (long)prVar2->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            }
            else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                                        &x1->high_low_container, pos1, &type1);

                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c1,
                                                      type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}